

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_tt__hheap_cleanup(nk_tt__hheap *hh)

{
  nk_tt__hheap_chunk *pnVar1;
  nk_tt__hheap_chunk *n;
  nk_tt__hheap_chunk *c;
  nk_tt__hheap *hh_local;
  
  n = hh->head;
  while (n != (nk_tt__hheap_chunk *)0x0) {
    pnVar1 = n->next;
    (*(hh->alloc).free)((hh->alloc).userdata,n);
    n = pnVar1;
  }
  return;
}

Assistant:

NK_INTERN void
nk_tt__hheap_cleanup(struct nk_tt__hheap *hh)
{
    struct nk_tt__hheap_chunk *c = hh->head;
    while (c) {
        struct nk_tt__hheap_chunk *n = c->next;
        hh->alloc.free(hh->alloc.userdata, c);
        c = n;
    }
}